

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squared_loss.cc
# Opt level: O0

void xLearn::sq_gradient_thread
               (DMatrix *matrix,Model *model,Score *score_func,bool is_norm,real_t *sum,
               index_t start,index_t end)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  ostream *poVar3;
  const_reference ppvVar4;
  const_reference pvVar5;
  byte in_CL;
  long *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  float *in_R8;
  uint in_R9D;
  float fVar6;
  uint in_stack_00000008;
  real_t pg;
  real_t error;
  real_t pred;
  real_t norm;
  SparseRow *row;
  size_t i;
  string *function;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  value_type vVar7;
  undefined8 in_stack_ffffffffffffff60;
  LogSeverity severity;
  value_type pvVar8;
  ulong local_98;
  allocator local_89;
  string local_88 [55];
  undefined1 local_51 [33];
  Logger local_30;
  uint local_2c;
  float *local_28;
  byte local_19;
  long *local_18;
  undefined8 local_10;
  long local_8;
  
  severity = (LogSeverity)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_19 = in_CL & 1;
  if (in_stack_00000008 < in_R9D) {
    local_2c = in_R9D;
    Logger::Logger(&local_30,ERR);
    function = (string *)local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_51 + 1),
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/squared_loss.cc"
               ,(allocator *)function);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"sq_gradient_thread",&local_89);
    poVar2 = Logger::Start(severity,(string *)
                                    CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                           in_stack_ffffffffffffff54,function);
    poVar2 = std::operator<<(poVar2,"CHECK_GE failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/squared_loss.cc"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x56);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"end");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_stack_00000008);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"start");
    poVar2 = std::operator<<(poVar2," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar2,local_2c);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string((string *)(local_51 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_51);
    Logger::~Logger((Logger *)poVar2);
    abort();
  }
  *in_R8 = 0.0;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_98 = (ulong)in_R9D; local_98 < in_stack_00000008; local_98 = local_98 + 1) {
    ppvVar4 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(local_8 + 0x18),local_98);
    pvVar8 = *ppvVar4;
    if ((local_19 & 1) == 0) {
      vVar7 = 1.0;
    }
    else {
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_8 + 0x48),local_98);
      vVar7 = *pvVar5;
    }
    fVar6 = (float)(**(code **)(*local_18 + 0x18))(vVar7,local_18,pvVar8,local_10);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(local_8 + 0x30),local_98);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)(*pvVar5 - fVar6)),ZEXT416((uint)(*pvVar5 - fVar6)),
                             ZEXT416((uint)*local_28));
    *local_28 = auVar1._0_4_;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(local_8 + 0x30),local_98);
    (**(code **)(*local_18 + 0x20))(fVar6 - *pvVar5,vVar7,local_18,pvVar8,local_10);
  }
  *local_28 = *local_28 * 0.5;
  return;
}

Assistant:

void sq_gradient_thread(const DMatrix* matrix,
                        Model* model,
                        Score* score_func,
                        bool is_norm,
                        real_t* sum,
                        index_t start,
                        index_t end) {
  CHECK_GE(end, start);
  *sum = 0;
  for (size_t i = start; i < end; ++i) {
    SparseRow* row = matrix->row[i];
    real_t norm = is_norm ? matrix->norm[i] : 1.0;
    real_t pred = score_func->CalcScore(row, *model, norm);
    // loss
    real_t error = matrix->Y[i] - pred;
    *sum += (error*error);
    // partial gradient: -error
    real_t pg = pred - matrix->Y[i];
    // real gradient and update
    score_func->CalcGrad(row, *model, pg, norm);
  }
  *sum *= 0.5;
}